

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

nodeclass * NodeClassResize(nodecontext *p,nodeclass *Old,size_t VMTSize)

{
  nodeclass *pnVar1;
  long *local_50;
  nodeclass **i;
  nodeclass *New;
  size_t VMTSize_local;
  nodeclass *Old_local;
  nodecontext *p_local;
  
  pnVar1 = (nodeclass *)(*p->NodeHeap->ReAlloc)(p->NodeHeap,Old,Old->VMTSize + 0x48,VMTSize + 0x48);
  if (pnVar1 != (nodeclass *)0x0) {
    pnVar1->VMTSize = VMTSize;
    if (p == (nodecontext *)0xffffffffffffff90) {
      __assert_fail("&(p->NodeClass)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x3ca,"nodeclass *NodeClassResize(nodecontext *, nodeclass *, size_t)");
    }
    local_50 = (long *)(p->NodeClass)._Begin;
    while( true ) {
      if (p == (nodecontext *)0xffffffffffffff90) {
        __assert_fail("&(p->NodeClass)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x3ca,"nodeclass *NodeClassResize(nodecontext *, nodeclass *, size_t)");
      }
      if (local_50 == (long *)((p->NodeClass)._Begin + ((p->NodeClass)._Used & 0xfffffffffffffff8)))
      break;
      if ((nodeclass *)*local_50 == Old) {
        *local_50 = (long)pnVar1;
      }
      if (*(nodeclass **)(*local_50 + 0x18) == Old) {
        *(nodeclass **)(*local_50 + 0x18) = pnVar1;
      }
      local_50 = local_50 + 1;
    }
  }
  return pnVar1;
}

Assistant:

static nodeclass* NodeClassResize(nodecontext* p,nodeclass* Old,size_t VMTSize)
{
    nodeclass* New = MemHeap_ReAlloc(p->NodeHeap,Old,sizeof(nodeclass)+Old->VMTSize,sizeof(nodeclass)+VMTSize);
    if (New)
    {
        nodeclass** i;

        New->VMTSize = VMTSize;

        for (i=ARRAYBEGIN(p->NodeClass,nodeclass*);i!=ARRAYEND(p->NodeClass,nodeclass*);++i)
        {
            if (*i == Old)
                *i = New;
            if ((*i)->ParentClass == Old)
                (*i)->ParentClass = New;
        }
    }
    return New;
}